

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proxy_functions_detail.hpp
# Opt level: O3

Boxed_Value
chaiscript::dispatch::detail::
call_func<chaiscript::Boxed_Value(*)(chaiscript::Boxed_Value,std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>const&),chaiscript::Boxed_Value,chaiscript::Boxed_Value,std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>const&,0ul,1ul>
          (element_type *param_1,undefined8 param_2,undefined8 *param_3,long *param_4,
          Type_Conversions_State *param_5)

{
  code *pcVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  Boxed_Value BVar3;
  chaiscript local_40 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_38;
  chaiscript local_30 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_28;
  
  pcVar1 = (code *)*param_3;
  boxed_cast<chaiscript::Boxed_Value>(local_30,(Boxed_Value *)*param_4,param_5);
  boxed_cast<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>const&>
            (local_40,(Boxed_Value *)(*param_4 + 0x10),param_5);
  (*pcVar1)(param_1,local_30,local_40);
  _Var2._M_pi = extraout_RDX;
  if (local_38 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38);
    _Var2._M_pi = extraout_RDX_00;
  }
  if (local_28 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_28);
    _Var2._M_pi = extraout_RDX_01;
  }
  BVar3.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = _Var2._M_pi;
  BVar3.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = param_1;
  return (Boxed_Value)
         BVar3.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Ret call_func(Ret (*)(Params...),
                    std::index_sequence<I...>,
                    const Callable &f,
                    [[maybe_unused]] const chaiscript::Function_Params &params,
                    [[maybe_unused]] const Type_Conversions_State &t_conversions) {
        return f(boxed_cast<Params>(params[I], &t_conversions)...);
      }